

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ProcessFullySpecifiedNode
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node)

{
  type pBVar1;
  ulong uVar2;
  E *this_00;
  ostream *poVar3;
  size_t sVar4;
  shared_ptr<BGIP_BnB_Node> *in_RSI;
  long in_RDI;
  BGIP_BnB_NodePtr *node_00;
  BGIP_BnB_NodePtr *in_stack_00000038;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_00000040;
  bool lowerBoundImproved;
  double value;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff28;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff30;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff38;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffff40;
  BGIP_BnB_NodePtr *node_01;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *this_01;
  char *in_stack_ffffffffffffff58;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffff60;
  shared_ptr<BGIP_BnB_Node> local_80 [3];
  byte local_49;
  BGIP_BnB_NodePtr local_48;
  double in_stack_ffffffffffffffd0;
  BGIP_BnB_NodePtr *node_02;
  BGIP_SolverBranchAndBound<JointPolicyPureVector> *in_stack_ffffffffffffffe0;
  
  pBVar1 = boost::shared_ptr<BGIP_BnB_Node>::operator->(in_RSI);
  uVar2 = BGIP_BnB_Node::IsFullySpecifiedPolicy((uint)pBVar1);
  if ((uVar2 & 1) != 0) {
    this_01 = (BGIP_SolverBranchAndBound<JointPolicyPureVector> *)&stack0xffffffffffffffc8;
    boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    node_00 = (BGIP_BnB_NodePtr *)
              ComputeValueOfFullySpecifiedPolicy(in_stack_00000040,in_stack_00000038);
    boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x1621eb);
    node_02 = node_00;
    if (3 < *(int *)(in_RDI + 0x110)) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "BGIP_SolverBranchAndBound Found fully specified policy with value ")
      ;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)node_02);
      poVar3 = std::operator<<(poVar3,":");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    node_01 = &local_48;
    boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    ConvertNodeToPolicyAndAddToSolution(in_stack_ffffffffffffffe0,node_02,in_stack_ffffffffffffffd0)
    ;
    boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x1622b0);
    local_49 = 0;
    if (*(double *)(in_RDI + 0x1b8) < (double)node_02) {
      *(BGIP_BnB_NodePtr **)(in_RDI + 0x1b8) = node_02;
      local_49 = 1;
      if (0 < *(int *)(in_RDI + 0x110)) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "BGIP_SolverBranchAndBound Updated max lower bound to ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x1b8));
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    sVar4 = BayesianGameIdenticalPayoffSolver::GetNrDesiredSolutions
                      ((BayesianGameIdenticalPayoffSolver *)0x162366);
    if (sVar4 < 2) {
      if ((local_49 & 1) == 0) {
        boost::shared_ptr<BGIP_BnB_Node>::shared_ptr(local_80,in_stack_ffffffffffffff28);
        PopAndDeleteNode(in_stack_ffffffffffffff60,node_00);
        boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x162463);
      }
      else {
        boost::shared_ptr<BGIP_BnB_Node>::operator=
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        Pop(this_01,node_01);
        boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x162412);
      }
    }
    else {
      boost::shared_ptr<BGIP_BnB_Node>::shared_ptr
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      Pop(this_01,node_01);
      boost::shared_ptr<BGIP_BnB_Node>::~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x16239b);
    }
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,in_stack_ffffffffffffff58);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void ProcessFullySpecifiedNode(BGIP_BnB_NodePtr node)
    {
        if(!node->IsFullySpecifiedPolicy(_m_maxDepth))
            throw(E("ProcessFullySpecifiedNode called with a node which is not fully specified"));

        // compute the true value of this jpol
        double value=ComputeValueOfFullySpecifiedPolicy(node);
        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound Found fully specified policy with value "
                      << value << ":" << std::endl;
        
        ConvertNodeToPolicyAndAddToSolution(node,value);

        bool lowerBoundImproved=false;
        // update max lowerbound if possible
        if(value > _m_maxLowerBound)
        {
            _m_maxLowerBound=value;
            lowerBoundImproved=true;
            if(_m_verbosity>=1)
                std::cout << "BGIP_SolverBranchAndBound Updated max lower bound to "
                          << _m_maxLowerBound << std::endl; 
        }

        if(this->GetNrDesiredSolutions()>1)
        {
            // if we want more than 1 solution, keep track of it in the
            // closed queue.
    //         if(lowerBoundImproved)
    //         {
    //         }
    //         else
    //         {
                Pop(node);
    //            _m_closedQueueFullySpecifiedNodes->push(node);
    //        }

        }
        else 
        {
            if(lowerBoundImproved)
            {
                //save the new best node
                _m_bestNode = node;
                //and remove it from the top of the priority queue
                Pop(node); 
            
                //", now pruning..." << std::endl;
                // now we could prune the queue, but that's slow
                // because of the need to reconstruct a new
                // priority queue, so instead we rely on
                // on-the-fly pruning
#if 0 // slow
                Prune(_m_maxLowerBound);
#endif
            }
            else // we only 
            {
                //remove the node from the prior.Q and delete it
                PopAndDeleteNode(node);
            }
        }
    }